

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_Blake2s_Simd128.c
# Opt level: O2

void Hacl_Hash_Blake2s_Simd128_hash_with_key_and_paramas
               (uint8_t *output,uint8_t *input,uint32_t input_len,
               Hacl_Hash_Blake2b_blake2_params params,uint8_t *key)

{
  Lib_IntVector_Intrinsics_vec128 b1 [4];
  ulong local_68;
  ulong uStack_60;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  b1[3][0] = 0;
  b1[3][1] = 0;
  b1[2][0] = 0;
  b1[2][1] = 0;
  b1[1][0] = 0;
  b1[1][1] = 0;
  b1[0][0] = 0;
  b1[0][1] = 0;
  local_48 = 0xbb67ae856a09e667;
  uStack_40 = 0xa54ff53a3c6ef372;
  local_38 = 0x9b05688c510e527f;
  uStack_30 = 0x5be0cd191f83d9ab;
  local_68 = CONCAT44(params.leaf_length,
                      (uint)(ushort)params._2_2_ << 0x10 | (uint)params.key_length << 8 |
                      (uint)params.digest_length) ^ 0xbb67ae856a09e667;
  uStack_60 = (params.node_offset & 0xffffffff |
              (ulong)(params._16_4_ << 0x10 ^ params.node_offset._4_4_) << 0x20) ^
              0xa54ff53a3c6ef372;
  local_58 = (uint)*(undefined8 *)params.salt ^ 0x510e527f;
  uStack_54 = (uint)((ulong)*(undefined8 *)params.salt >> 0x20) ^ 0x9b05688c;
  uStack_50 = (uint)*(undefined8 *)params.personal ^ 0x1f83d9ab;
  uStack_4c = (uint)((ulong)*(undefined8 *)params.personal >> 0x20) ^ 0x5be0cd19;
  update(b1,(Lib_IntVector_Intrinsics_vec128 *)&local_68,(uint)params.key_length,key,input_len,input
        );
  Hacl_Hash_Blake2s_Simd128_finish
            ((uint)params.digest_length,output,(Lib_IntVector_Intrinsics_vec128 *)&local_68);
  Lib_Memzero0_memzero0(b1,0x40);
  Lib_Memzero0_memzero0((Lib_IntVector_Intrinsics_vec128 *)&local_68,0x40);
  return;
}

Assistant:

void
Hacl_Hash_Blake2s_Simd128_hash_with_key_and_paramas(
  uint8_t *output,
  uint8_t *input,
  uint32_t input_len,
  Hacl_Hash_Blake2b_blake2_params params,
  uint8_t *key
)
{
  KRML_PRE_ALIGN(16) Lib_IntVector_Intrinsics_vec128 b[4U] KRML_POST_ALIGN(16) = { 0U };
  KRML_PRE_ALIGN(16) Lib_IntVector_Intrinsics_vec128 b1[4U] KRML_POST_ALIGN(16) = { 0U };
  uint32_t tmp[8U] = { 0U };
  Lib_IntVector_Intrinsics_vec128 *r0 = b;
  Lib_IntVector_Intrinsics_vec128 *r1 = b + 1U;
  Lib_IntVector_Intrinsics_vec128 *r2 = b + 2U;
  Lib_IntVector_Intrinsics_vec128 *r3 = b + 3U;
  uint32_t iv0 = Hacl_Hash_Blake2b_ivTable_S[0U];
  uint32_t iv1 = Hacl_Hash_Blake2b_ivTable_S[1U];
  uint32_t iv2 = Hacl_Hash_Blake2b_ivTable_S[2U];
  uint32_t iv3 = Hacl_Hash_Blake2b_ivTable_S[3U];
  uint32_t iv4 = Hacl_Hash_Blake2b_ivTable_S[4U];
  uint32_t iv5 = Hacl_Hash_Blake2b_ivTable_S[5U];
  uint32_t iv6 = Hacl_Hash_Blake2b_ivTable_S[6U];
  uint32_t iv7 = Hacl_Hash_Blake2b_ivTable_S[7U];
  r2[0U] = Lib_IntVector_Intrinsics_vec128_load32s(iv0, iv1, iv2, iv3);
  r3[0U] = Lib_IntVector_Intrinsics_vec128_load32s(iv4, iv5, iv6, iv7);
  KRML_MAYBE_FOR2(i,
    0U,
    2U,
    1U,
    uint32_t *os = tmp + 4U;
    uint8_t *bj = params.salt + i * 4U;
    uint32_t u = load32_le(bj);
    uint32_t r = u;
    uint32_t x = r;
    os[i] = x;);
  KRML_MAYBE_FOR2(i,
    0U,
    2U,
    1U,
    uint32_t *os = tmp + 6U;
    uint8_t *bj = params.personal + i * 4U;
    uint32_t u = load32_le(bj);
    uint32_t r = u;
    uint32_t x = r;
    os[i] = x;);
  tmp[0U] =
    (uint32_t)params.digest_length
    ^
      ((uint32_t)params.key_length
      << 8U
      ^ ((uint32_t)params.fanout << 16U ^ (uint32_t)params.depth << 24U));
  tmp[1U] = params.leaf_length;
  tmp[2U] = (uint32_t)params.node_offset;
  tmp[3U] =
    (uint32_t)(params.node_offset >> 32U)
    ^ ((uint32_t)params.node_depth << 16U ^ (uint32_t)params.inner_length << 24U);
  uint32_t tmp0 = tmp[0U];
  uint32_t tmp1 = tmp[1U];
  uint32_t tmp2 = tmp[2U];
  uint32_t tmp3 = tmp[3U];
  uint32_t tmp4 = tmp[4U];
  uint32_t tmp5 = tmp[5U];
  uint32_t tmp6 = tmp[6U];
  uint32_t tmp7 = tmp[7U];
  uint32_t iv0_ = iv0 ^ tmp0;
  uint32_t iv1_ = iv1 ^ tmp1;
  uint32_t iv2_ = iv2 ^ tmp2;
  uint32_t iv3_ = iv3 ^ tmp3;
  uint32_t iv4_ = iv4 ^ tmp4;
  uint32_t iv5_ = iv5 ^ tmp5;
  uint32_t iv6_ = iv6 ^ tmp6;
  uint32_t iv7_ = iv7 ^ tmp7;
  r0[0U] = Lib_IntVector_Intrinsics_vec128_load32s(iv0_, iv1_, iv2_, iv3_);
  r1[0U] = Lib_IntVector_Intrinsics_vec128_load32s(iv4_, iv5_, iv6_, iv7_);
  update(b1, b, (uint32_t)params.key_length, key, input_len, input);
  Hacl_Hash_Blake2s_Simd128_finish((uint32_t)params.digest_length, output, b);
  Lib_Memzero0_memzero(b1, 4U, Lib_IntVector_Intrinsics_vec128, void *);
  Lib_Memzero0_memzero(b, 4U, Lib_IntVector_Intrinsics_vec128, void *);
}